

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

bool __thiscall slang::parsing::Token::isOnSameLine(Token *this)

{
  bool bVar1;
  reference this_00;
  SyntaxNode *pSVar2;
  size_type sVar3;
  string_view sVar4;
  size_t offset;
  Trivia *t;
  iterator __end2;
  iterator __begin2;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *__range2;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  TriviaKind in_stack_ffffffffffffffa7;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb8;
  Token *in_stack_ffffffffffffffc0;
  __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
  local_30;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_28;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *local_18;
  
  local_28 = trivia(in_stack_ffffffffffffffc0);
  local_18 = &local_28;
  local_30._M_current =
       (Trivia *)
       std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::begin
                 (in_stack_ffffffffffffff98);
  std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::end(in_stack_ffffffffffffffa8);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                        *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                       (__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff98);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return true;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
              ::operator*(&local_30);
    in_stack_ffffffffffffffa7 = this_00->kind;
    if ((byte)(in_stack_ffffffffffffffa7 - EndOfLine) < 2) {
      return false;
    }
    if (in_stack_ffffffffffffffa7 == BlockComment) {
      sVar4 = Trivia::getRawText((Trivia *)CONCAT17(4,in_stack_ffffffffffffffa0));
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
                         in_stack_ffffffffffffffb8,(size_type)sVar4._M_str);
      if (sVar3 != 0xffffffffffffffff) {
        return false;
      }
      in_stack_ffffffffffffffb8 = (char *)0xffffffffffffffff;
    }
    else {
      if ((byte)(in_stack_ffffffffffffffa7 - DisabledText) < 3) {
        return false;
      }
      if ((in_stack_ffffffffffffffa7 == Directive) &&
         (pSVar2 = Trivia::syntax(this_00), pSVar2->kind != MacroUsage)) {
        return false;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

bool Token::isOnSameLine() const {
    for (auto& t : trivia()) {
        switch (t.kind) {
            case TriviaKind::LineComment:
            case TriviaKind::EndOfLine:
            case TriviaKind::SkippedSyntax:
            case TriviaKind::SkippedTokens:
            case TriviaKind::DisabledText:
                return false;
            case TriviaKind::Directive:
                if (t.syntax()->kind != SyntaxKind::MacroUsage)
                    return false;
                break;
            case TriviaKind::BlockComment:
                if (size_t offset = t.getRawText().find_first_of("\r\n");
                    offset != std::string_view::npos) {
                    return false;
                }
                break;
            default:
                break;
        }
    }
    return true;
}